

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base_*>,_phmap::priv::HashEq<cs::token_base_*,_void>::Hash,_phmap::priv::HashEq<cs::token_base_*,_void>::Eq,_std::allocator<cs::token_base_*>_>
           *this,size_t i,ctrl_t h)

{
  if (i < this->capacity_) {
    this->ctrl_[i] = h;
    this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (i - 0x10 & this->capacity_)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x9cd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::token_base *>, phmap::priv::HashEq<cs::token_base *>::Hash, phmap::priv::HashEq<cs::token_base *>::Eq, std::allocator<cs::token_base *>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashSetPolicy<cs::token_base *>, Hash = phmap::priv::HashEq<cs::token_base *>::Hash, Eq = phmap::priv::HashEq<cs::token_base *>::Eq, Alloc = std::allocator<cs::token_base *>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h)
			{
				assert(i < capacity_);

				if (IsFull(h)) {
					SanitizerUnpoisonObject(slots_ + i);
				}
				else {
					SanitizerPoisonObject(slots_ + i);
				}

				ctrl_[i] = h;
				ctrl_[((i - Group::kWidth) & capacity_) + 1 +
				                           ((Group::kWidth - 1) & capacity_)] = h;
			}